

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubEq
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  BasicHeapType BVar2;
  value_type *pvVar3;
  uintptr_t uVar4;
  HeapType *this_00;
  uint uVar5;
  undefined1 local_50 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> arrayCandidates;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> candidates;
  
  uVar1 = Random::upTo(this->rand,0x10);
  switch(uVar1) {
  case 0:
    this_00 = (HeapType *)&HeapTypes::eq;
    break;
  case 1:
    this_00 = (HeapType *)&HeapTypes::array;
    break;
  case 2:
    this_00 = (HeapType *)&HeapTypes::struct_;
    break;
  case 3:
    this_00 = (HeapType *)&HeapTypes::none;
    break;
  default:
    getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this,share);
    getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50,this,share);
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    insert<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,void>
              ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
               &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (const_iterator)
               candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                )local_50,
               (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                )arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    if (candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      uVar5 = uVar1 >> 2;
      if (uVar5 == 3) {
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
      }
      else if (uVar5 == 2) {
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,share);
      }
      else {
        if (uVar5 != 1) {
          wasm::handle_unreachable
                    ("unexpected index",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                     ,0x181);
        }
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::array,share);
      }
      uVar4 = (uintptr_t)BVar2;
    }
    else {
      pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this->rand,
                          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &arrayCandidates.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar4 = pvVar3->id;
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    return (HeapType)uVar4;
  }
  BVar2 = HeapType::getBasic(this_00,share);
  return (HeapType)(ulong)BVar2;
}

Assistant:

HeapType pickSubEq(Shareability share) {
    auto choice = rand.upTo(16);
    switch (choice) {
      case 0:
        return HeapTypes::eq.getBasic(share);
      case 1:
        return HeapTypes::array.getBasic(share);
      case 2:
        return HeapTypes::struct_.getBasic(share);
      case 3:
        return HeapTypes::none.getBasic(share);
      default: {
        auto candidates = getKindCandidates<StructKind>(share);
        auto arrayCandidates = getKindCandidates<ArrayKind>(share);
        candidates.insert(
          candidates.end(), arrayCandidates.begin(), arrayCandidates.end());
        if (candidates.size()) {
          return rand.pick(candidates);
        }
        switch (choice >> 2) {
          case 0:
            return HeapTypes::eq.getBasic(share);
          case 1:
            return HeapTypes::array.getBasic(share);
          case 2:
            return HeapTypes::struct_.getBasic(share);
          case 3:
            return HeapTypes::none.getBasic(share);
          default:
            WASM_UNREACHABLE("unexpected index");
        }
      }
    }
  }